

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

void bn_sub_modulus(u8 *a,u8 *N,u32 n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (n != 0) {
    uVar1 = n - 1;
    uVar2 = 0;
    do {
      uVar3 = N[uVar1] + uVar2;
      uVar2 = (uint)(a[uVar1] < uVar3);
      a[uVar1] = a[uVar1] - (char)uVar3;
      uVar1 = uVar1 - 1;
    } while (uVar1 < n);
  }
  return;
}

Assistant:

void bn_sub_modulus(u8 *a, u8 *N, u32 n)
{
	u32 i;
	u32 dig;
	u8 c;

	c = 0;
	for (i = n - 1; i < n; i--) {
		dig = N[i] + c;
		c = (a[i] < dig);
		a[i] -= dig;
	}
}